

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

IntegralConvertResult
absl::str_format_internal::FormatConvertImpl
          (VoidPtr v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  FormatSinkImpl *in_R8;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  IntDigits as_digits;
  
  conv_00._0_4_ = conv.precision_;
  if (v.value == 0) {
    v_00._M_str = "(nil)";
    v_00._M_len = 5;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_long>(&as_digits,v.value);
    conv_00.width_ = 0;
    conv_00.precision_ = (int)sink;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&as_digits,conv._0_8_,conv_00,in_R8)
    ;
  }
  return (IntegralConvertResult)true;
}

Assistant:

ArgConvertResult<FormatConversionCharSetInternal::p> FormatConvertImpl(
    VoidPtr v, const FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  if (!v.value) {
    sink->Append("(nil)");
    return {true};
  }
  IntDigits as_digits;
  as_digits.PrintAsHexLower(v.value);
  return {ConvertIntImplInnerSlow(as_digits, conv, sink)};
}